

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_beta_decode_char(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = *out_size;
  if ((c->field_6).external.type == 0) {
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        out[uVar3] = -(c->field_6).byte_array_stop.stop;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else if (0 < (int)uVar1) {
    uVar3 = 0;
    do {
      uVar2 = get_bits_MSB(in,(c->field_6).beta.nbits);
      out[uVar3] = (char)uVar2 - (char)(c->field_6).huffman.ncodes;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return 0;
}

Assistant:

int cram_beta_decode_char(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int i, n;

    if (c->beta.nbits) {
	for (i = 0, n = *out_size; i < n; i++)
	    out[i] = get_bits_MSB(in, c->beta.nbits) - c->beta.offset;
    } else {
	for (i = 0, n = *out_size; i < n; i++)
	    out[i] = -c->beta.offset;
    }

    return 0;
}